

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::DelayedSequenceElementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DelayedSequenceElementSyntax *this,size_t index)

{
  SelectorSyntax *pSVar1;
  Token local_20;
  
  switch(index) {
  case 0:
    local_20.kind = (this->doubleHash).kind;
    local_20._2_1_ = (this->doubleHash).field_0x2;
    local_20.numFlags.raw = (this->doubleHash).numFlags.raw;
    local_20.rawLen = (this->doubleHash).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->doubleHash).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->doubleHash).info + 4);
    break;
  case 1:
    pSVar1 = (SelectorSyntax *)this->delayVal;
    goto LAB_002072bc;
  case 2:
    local_20.kind = (this->openBracket).kind;
    local_20._2_1_ = (this->openBracket).field_0x2;
    local_20.numFlags.raw = (this->openBracket).numFlags.raw;
    local_20.rawLen = (this->openBracket).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->openBracket).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->openBracket).info + 4);
    break;
  case 3:
    local_20.kind = (this->op).kind;
    local_20._2_1_ = (this->op).field_0x2;
    local_20.numFlags.raw = (this->op).numFlags.raw;
    local_20.rawLen = (this->op).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->op).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->op).info + 4);
    break;
  case 4:
    pSVar1 = this->range;
    goto LAB_002072bc;
  case 5:
    local_20.kind = (this->closeBracket).kind;
    local_20._2_1_ = (this->closeBracket).field_0x2;
    local_20.numFlags.raw = (this->closeBracket).numFlags.raw;
    local_20.rawLen = (this->closeBracket).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->closeBracket).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->closeBracket).info + 4);
    break;
  case 6:
    pSVar1 = (SelectorSyntax *)(this->expr).ptr;
LAB_002072bc:
    *(SelectorSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pSVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DelayedSequenceElementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return doubleHash;
        case 1: return delayVal;
        case 2: return openBracket;
        case 3: return op;
        case 4: return range;
        case 5: return closeBracket;
        case 6: return expr.get();
        default: return nullptr;
    }
}